

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O0

int tool_readbusy_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  int iVar2;
  long lVar3;
  timediff_t tVar4;
  curltime cVar5;
  curltime newer;
  curltime older;
  curltime now;
  OperationConfig *config;
  per_transfer *per;
  curl_off_t ulnow_local;
  curl_off_t ultotal_local;
  curl_off_t dlnow_local;
  curl_off_t dltotal_local;
  void *clientp_local;
  
  lVar1 = *(long *)((long)clientp + 0x10);
  if ((*(ulong *)(lVar1 + 0x4e4) >> 0x1d & 1) != 0) {
    if (tool_readbusy_cb::ulprev == ulnow) {
      cVar5 = curlx_now();
      dlnow = cVar5._8_8_;
      if (tool_readbusy_cb::prev.tv_sec != 0) {
        lVar3 = tool_readbusy_cb::rate / 4;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar5._0_12_,0);
        newer.tv_usec = SUB124(cVar5._0_12_,8);
        older.tv_usec = tool_readbusy_cb::prev.tv_usec;
        older.tv_sec = tool_readbusy_cb::prev.tv_sec;
        older._12_4_ = 0;
        tVar4 = curlx_timediff(newer,older);
        dlnow = tVar4 % 4;
        tool_readbusy_cb::rate = tool_readbusy_cb::rate - (lVar3 - tVar4 / 4);
      }
      tool_readbusy_cb::prev._12_4_ = now.tv_sec._4_4_;
      tool_readbusy_cb::prev.tv_usec = cVar5.tv_usec;
      tool_readbusy_cb::prev.tv_sec = cVar5.tv_sec;
    }
    else {
      tool_readbusy_cb::rate = 0x32;
      tool_readbusy_cb::ulprev = ulnow;
    }
    if (tool_readbusy_cb::rate < 0x32) {
      tool_go_sleep(0x19);
    }
    else {
      *(ulong *)(lVar1 + 0x4e4) = *(ulong *)(lVar1 + 0x4e4) & 0xffffffffdfffffff;
      curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0,dlnow);
    }
  }
  iVar2 = 0x10000001;
  if ((*(byte *)((long)clientp + 0x1d8) >> 1 & 1) != 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int tool_readbusy_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;

  (void)dltotal;  /* unused */
  (void)dlnow;  /* unused */
  (void)ultotal;  /* unused */
  (void)ulnow;  /* unused */

  if(config->readbusy) {
    /* lame code to keep the rate down because the input might not deliver
       anything, get paused again and come back here immediately */
    static timediff_t rate = 500;
    static struct curltime prev;
    static curl_off_t ulprev;

    if(ulprev == ulnow) {
      /* it did not upload anything since last call */
      struct curltime now = curlx_now();
      if(prev.tv_sec)
        /* get a rolling average rate */
        rate -= rate/4 - curlx_timediff(now, prev)/4;
      prev = now;
    }
    else {
      rate = 50;
      ulprev = ulnow;
    }
    if(rate >= 50) {
      /* keeps the looping down to 20 times per second in the crazy case */
      config->readbusy = FALSE;
      curl_easy_pause(per->curl, CURLPAUSE_CONT);
    }
    else
      /* sleep half a period */
      tool_go_sleep(25);
  }

  return per->noprogress ? 0 : CURL_PROGRESSFUNC_CONTINUE;
}